

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

_Bool cs_reg_read(csh ud,cs_insn *insn,uint reg_id)

{
  cs_struct *handle;
  uint reg_id_local;
  cs_insn *insn_local;
  csh ud_local;
  
  if (ud == 0) {
    ud_local._7_1_ = false;
  }
  else if (*(int *)(ud + 0xe0) == 0) {
    *(undefined4 *)(ud + 0x58) = 7;
    ud_local._7_1_ = false;
  }
  else if (insn->id == 0) {
    *(undefined4 *)(ud + 0x58) = 0xb;
    ud_local._7_1_ = false;
  }
  else if (insn->detail == (cs_detail *)0x0) {
    *(undefined4 *)(ud + 0x58) = 7;
    ud_local._7_1_ = false;
  }
  else {
    ud_local._7_1_ = arr_exist(insn->detail->regs_read,insn->detail->regs_read_count,reg_id);
  }
  return ud_local._7_1_;
}

Assistant:

CAPSTONE_EXPORT
bool cs_reg_read(csh ud, const cs_insn *insn, unsigned int reg_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist(insn->detail->regs_read, insn->detail->regs_read_count, reg_id);
}